

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O3

QString * QSqlQueryModelSql::asc(QString *__return_storage_ptr__,QString *s)

{
  long lVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QString *pQVar4;
  long *plVar5;
  QArrayData *pQVar6;
  long lVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QArrayData *local_38;
  char16_t *local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.m_data = (storage_type *)0x3;
  QVar9.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar9);
  pQVar3 = local_38;
  lVar1 = (s->d).size;
  pQVar6 = local_38;
  lVar7 = local_28;
  pcVar8 = local_30;
  if (lVar1 != 0) {
    if (local_28 != 0) {
      local_38 = &((s->d).d)->super_QArrayData;
      local_30 = (s->d).ptr;
      if (local_38 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar10.m_data = (char *)0x1;
      QVar10.m_size = (qsizetype)&local_38;
      local_28 = lVar1;
      pQVar4 = (QString *)QString::append(QVar10);
      plVar5 = (long *)QString::append(pQVar4);
      pDVar2 = (Data *)*plVar5;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (char16_t *)plVar5[1];
      (__return_storage_ptr__->d).size = plVar5[2];
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_38 != (QArrayData *)0x0) {
        LOCK();
        (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38,2,0x10);
        }
      }
      goto LAB_00135719;
    }
    pQVar6 = &((s->d).d)->super_QArrayData;
    lVar7 = lVar1;
    pcVar8 = (s->d).ptr;
  }
  (__return_storage_ptr__->d).d = (Data *)pQVar6;
  (__return_storage_ptr__->d).ptr = pcVar8;
  (__return_storage_ptr__->d).size = lVar7;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&pQVar6->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar6->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00135719:
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline const static QString concat(const QString &a, const QString &b) { return a.isEmpty() ? b : b.isEmpty() ? a : QString(a).append(sp()).append(b); }